

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O0

void __thiscall cppwinrt::writer::save_header(writer *this,char impl)

{
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  char impl_local;
  writer *this_local;
  
  filename.field_2._M_local_buf[0xf] = impl;
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (settings + 0x60),"winrt/");
  if (filename.field_2._M_local_buf[0xf] != '\0') {
    ::std::__cxx11::string::operator+=((string *)local_38,"impl/");
  }
  ::std::__cxx11::string::operator+=((string *)local_38,(string *)&this->type_namespace);
  if (filename.field_2._M_local_buf[0xf] != '\0') {
    ::std::__cxx11::string::operator+=((string *)local_38,'.');
    ::std::__cxx11::string::operator+=((string *)local_38,filename.field_2._M_local_buf[0xf]);
  }
  ::std::__cxx11::string::operator+=((string *)local_38,".h");
  writer_base<cppwinrt::writer>::flush_to_file
            (&this->super_writer_base<cppwinrt::writer>,(string *)local_38);
  ::std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void save_header(char impl = 0)
        {
            auto filename{ settings.output_folder + "winrt/" };

            if (impl)
            {
                filename += "impl/";
            }

            filename += type_namespace;

            if (impl)
            {
                filename += '.';
                filename += impl;
            }

            filename += ".h";
            flush_to_file(filename);
        }